

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph.h
# Opt level: O0

void pgraph_vtx_cmp(pgraph_state *state,int xy,int idx,bool weird)

{
  int local_24;
  uint32_t local_20;
  int stat;
  int32_t val;
  bool weird_local;
  int idx_local;
  int xy_local;
  pgraph_state *state_local;
  
  local_20 = state->vtx_xy[idx][xy];
  if (weird) {
    local_20 = local_20 << 1;
  }
  local_24 = 0;
  if ((int)local_20 < 0) {
    local_24 = 1;
  }
  else if (0 < (int)local_20) {
    local_24 = 2;
  }
  state->xy_misc_4[xy] = state->xy_misc_4[xy] & 0xcfffffff | local_24 << 0x1c;
  return;
}

Assistant:

static inline void pgraph_vtx_cmp(struct pgraph_state *state, int xy, int idx, bool weird) {
	int32_t val = state->vtx_xy[idx][xy];
	if (weird) {
		val <<= 1;
	}
	int stat = 0;
	if (val < 0)
		stat = 1;
	else if (val > 0)
		stat = 2;
	insrt(state->xy_misc_4[xy], 28, 2, stat);
}